

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

void __thiscall ONX_Model::ONX_Model(ONX_Model *this)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  ONX_ModelPrivate *this_00;
  ON_Sun *this_01;
  
  this->_vptr_ONX_Model = (_func_int **)&PTR__ONX_Model_0080f508;
  this->m_3dm_file_version = 0;
  this->m_3dm_opennurbs_version = 0;
  this->m_3dm_file_byte_count = 0;
  ON_String::ON_String(&this->m_sStartSectionComments);
  ON_3dmProperties::ON_3dmProperties(&this->m_properties);
  ON_3dmSettings::ON_3dmSettings(&this->m_settings);
  (this->m_userdata_table)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080f5d0;
  (this->m_userdata_table).m_a = (ONX_Model_UserData **)0x0;
  (this->m_userdata_table).m_count = 0;
  (this->m_userdata_table).m_capacity = 0;
  ON_ModelComponentReference::CreateConstantSystemComponentReference
            (&this->m_default_render_material,&ON_Material::Default.super_ON_ModelComponent);
  ON_ModelComponentReference::CreateConstantSystemComponentReference
            (&this->m_default_line_pattern,&ON_Linetype::Continuous.super_ON_ModelComponent);
  ON_ModelComponentReference::CreateConstantSystemComponentReference
            (&this->m_default_layer,&ON_Layer::Default.super_ON_ModelComponent);
  ON_ModelComponentReference::CreateConstantSystemComponentReference
            (&this->m_default_text_style,&ON_TextStyle::Default.super_ON_ModelComponent);
  ON_ModelComponentReference::CreateConstantSystemComponentReference
            (&this->m_default_dimension_style,&ON_DimStyle::Default.super_ON_ModelComponent);
  ON_ComponentManifest::ON_ComponentManifest(&this->m_manifest);
  ON_ManifestMap::ON_ManifestMap(&this->m_original_to_manifest_map);
  ON_ManifestMap::ON_ManifestMap(&this->m_manifest_to_original_map);
  ON_SerialNumberMap::ON_SerialNumberMap(&this->m_mcr_sn_map);
  ON_FixedSizePool::ON_FixedSizePool(&this->m_mcr_link_fsp);
  lVar7 = 0x9a4;
  do {
    *(undefined1 *)((long)this + lVar7 + -4) = 0;
    puVar1 = (undefined8 *)((long)&this->_vptr_ONX_Model + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&this->m_3dm_file_byte_count + lVar7) = 0;
    dVar6 = ON_BoundingBox::UnsetBoundingBox.m_max.z;
    dVar5 = ON_BoundingBox::UnsetBoundingBox.m_max.x;
    dVar4 = ON_BoundingBox::UnsetBoundingBox.m_min.z;
    dVar3 = ON_BoundingBox::UnsetBoundingBox.m_min.y;
    dVar2 = ON_BoundingBox::UnsetBoundingBox.m_min.x;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0xb24);
  (this->m_model_geometry_bbox).m_max.y = ON_BoundingBox::UnsetBoundingBox.m_max.y;
  (this->m_model_geometry_bbox).m_max.z = dVar6;
  (this->m_model_geometry_bbox).m_min.z = dVar4;
  (this->m_model_geometry_bbox).m_max.x = dVar5;
  (this->m_model_geometry_bbox).m_min.x = dVar2;
  (this->m_model_geometry_bbox).m_min.y = dVar3;
  dVar6 = ON_BoundingBox::UnsetBoundingBox.m_max.z;
  dVar5 = ON_BoundingBox::UnsetBoundingBox.m_max.y;
  dVar4 = ON_BoundingBox::UnsetBoundingBox.m_max.x;
  dVar3 = ON_BoundingBox::UnsetBoundingBox.m_min.z;
  dVar2 = ON_BoundingBox::UnsetBoundingBox.m_min.y;
  (this->m_render_light_bbox).m_min.x = ON_BoundingBox::UnsetBoundingBox.m_min.x;
  (this->m_render_light_bbox).m_min.y = dVar2;
  (this->m_render_light_bbox).m_min.z = dVar3;
  (this->m_render_light_bbox).m_max.x = dVar4;
  (this->m_render_light_bbox).m_max.y = dVar5;
  (this->m_render_light_bbox).m_max.z = dVar6;
  this->m_model_user_string_list = (ON_DocumentUserStringList *)0x0;
  this_00 = (ONX_ModelPrivate *)::operator_new(0x28);
  ONX_ModelPrivate::ONX_ModelPrivate(this_00,this);
  this->m_private = this_00;
  this_01 = ON_3dmRenderSettings::Sun(&(this->m_settings).m_RenderSettings);
  ON_Sun::UseEarthAnchorPoint(this_01,&(this->m_settings).m_earth_anchor_point);
  return;
}

Assistant:

ONX_Model::ONX_Model()
{
  m_private = new ONX_ModelPrivate(*this);

  // Tell the sun in our render settings to use the earth anchor point in our settings.
  m_settings.m_RenderSettings.Sun().UseEarthAnchorPoint(m_settings.m_earth_anchor_point);
}